

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O3

Constraint *
slang::ast::ExpressionConstraint::fromSyntax(ExpressionConstraintSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ASTContext *pAVar3;
  InvalidConstraint *pIVar4;
  ConstraintExprVisitor *args_00;
  bool isSoft;
  ConstraintExprVisitor visitor;
  bool local_39;
  ConstraintExprVisitor local_38;
  Expression *args;
  
  this = ((context->scope).ptr)->compilation;
  local_39 = (syntax->soft).kind == SoftKeyword;
  iVar2 = Expression::bind((int)(syntax->expr).ptr,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar2);
  pAVar3 = (ASTContext *)
           BumpAllocator::
           emplace<slang::ast::ExpressionConstraint,slang::ast::Expression_const&,bool&>
                     (&this->super_BumpAllocator,args,&local_39);
  bVar1 = Expression::bad(args);
  if (bVar1) {
    args_00 = &local_38;
  }
  else {
    local_38.failed = false;
    local_38.isTop = true;
    local_38.sawRandVars = false;
    local_38.isSoft = local_39;
    local_38.context = context;
    bVar1 = Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
                      (args,args,&local_38);
    if (bVar1) {
      return (Constraint *)pAVar3;
    }
    args_00 = (ConstraintExprVisitor *)&stack0xffffffffffffffd8;
  }
  args_00->context = pAVar3;
  pIVar4 = BumpAllocator::emplace<slang::ast::InvalidConstraint,slang::ast::Constraint_const*&>
                     (&this->super_BumpAllocator,(Constraint **)args_00);
  return &pIVar4->super_Constraint;
}

Assistant:

Constraint& ExpressionConstraint::fromSyntax(const ExpressionConstraintSyntax& syntax,
                                             const ASTContext& context) {
    auto& comp = context.getCompilation();
    bool isSoft = syntax.soft.kind == TokenKind::SoftKeyword;
    auto& expr = Expression::bind(*syntax.expr, context);
    auto result = comp.emplace<ExpressionConstraint>(expr, isSoft);
    if (expr.bad())
        return badConstraint(comp, result);

    ConstraintExprVisitor visitor(context, isSoft);
    if (!expr.visit(visitor))
        return badConstraint(comp, result);

    return *result;
}